

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

PFunction * CreateAnonymousFunction(PClass *containingclass,PType *returntype,int flags)

{
  PFunction *this;
  PPrototype *proto;
  DWORD funcflags;
  TArray<FName,_FName> argnames;
  TArray<unsigned_int,_unsigned_int> argflags;
  TArray<PType_*,_PType_*> args;
  TArray<PType_*,_PType_*> rets;
  FName local_24;
  
  TArray<PType_*,_PType_*>::TArray(&rets,1);
  args.Array = (PType **)0x0;
  args.Most = 0;
  args.Count = 0;
  argflags.Array = (uint *)0x0;
  argflags.Most = 0;
  argflags.Count = 0;
  argnames.Array = (FName *)0x0;
  argnames.Most = 0;
  argnames.Count = 0;
  funcflags = (uint)((flags & 0xeU) != 0) * 4 + 2;
  if (returntype == (PType *)0x0) {
    returntype = &TypeError->super_PType;
  }
  *rets.Array = returntype;
  SetImplicitArgs(&args,&argflags,&argnames,(PStruct *)containingclass,funcflags,flags);
  this = (PFunction *)DObject::operator_new(0x40);
  local_24.Index = 0;
  PFunction::PFunction(this,(PStruct *)containingclass,&local_24);
  proto = NewPrototype(&rets,&args);
  PFunction::AddVariant(this,proto,&argflags,&argnames,(VMFunction *)0x0,funcflags,flags);
  TArray<FName,_FName>::~TArray(&argnames);
  TArray<unsigned_int,_unsigned_int>::~TArray(&argflags);
  TArray<PType_*,_PType_*>::~TArray(&args);
  TArray<PType_*,_PType_*>::~TArray(&rets);
  return this;
}

Assistant:

PFunction *CreateAnonymousFunction(PClass *containingclass, PType *returntype, int flags)
{
	TArray<PType *> rets(1);
	TArray<PType *> args;
	TArray<uint32_t> argflags;
	TArray<FName> argnames;

	// Functions that only get flagged for actors do not need the additional two context parameters.
	int fflags = (flags& (SUF_OVERLAY | SUF_WEAPON | SUF_ITEM)) ? VARF_Action | VARF_Method : VARF_Method;

	rets[0] = returntype != nullptr? returntype : TypeError;	// Use TypeError as placeholder if we do not know the return type yet.
	SetImplicitArgs(&args, &argflags, &argnames, containingclass, fflags, flags);

	PFunction *sym = new PFunction(containingclass, NAME_None);	// anonymous functions do not have names.
	sym->AddVariant(NewPrototype(rets, args), argflags, argnames, nullptr, fflags, flags);
	return sym;
}